

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::TestGroup::TestGroup(TestGroup *this,Context *ctx)

{
  Context *this_00;
  FormatEntries fmtRange;
  FormatExtEntries extRange;
  
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,ctx,"completeness","Completeness tests");
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestGroup_00c25380;
  (this->m_checkerFactory).super_CheckerFactory._vptr_CheckerFactory =
       (_func_int **)&PTR_createChecker_00c25580;
  this_00 = &this->m_fboc;
  deqp::gls::fboc::details::Context::Context
            (this_00,ctx->m_testCtx,ctx->m_renderCtx,&(this->m_checkerFactory).super_CheckerFactory)
  ;
  fmtRange.m_end =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)&DAT_00c25308;
  fmtRange.m_begin =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es3Formats;
  deqp::gls::fboc::details::Context::addFormats(this_00,fmtRange);
  extRange.m_end = (FormatExtEntry *)&vtable;
  extRange.m_begin = (FormatExtEntry *)s_es3ExtFormats;
  deqp::gls::fboc::details::Context::addExtFormats(this_00,extRange);
  (this->m_fboc).m_haveMultiColorAtts = true;
  return;
}

Assistant:

TestGroup::TestGroup (Context& ctx)
	: TestCaseGroup		(ctx, "completeness", "Completeness tests")
	, m_checkerFactory	()
	, m_fboc			(ctx.getTestContext(), ctx.getRenderContext(), m_checkerFactory)
{
	const FormatEntries stdRange = GLS_ARRAY_RANGE(s_es3Formats);
	const FormatExtEntries extRange = GLS_ARRAY_RANGE(s_es3ExtFormats);

	m_fboc.addFormats(stdRange);
	m_fboc.addExtFormats(extRange);
	m_fboc.setHaveMulticolorAtts(true); // Vanilla ES3 has multiple color attachments
}